

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

void free_code(code_pointer cp)

{
  void *pvVar1;
  uint64 i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (cp->inst).size; uVar2 = uVar2 + 1) {
    pvVar1 = (*(cp->inst).get_ele)(&cp->inst,uVar2);
    free(*(void **)((long)pvVar1 + 8));
  }
  free((cp->inst).start);
  return;
}

Assistant:

void free_code(code_pointer cp) {
    struct vec *ex = &cp->inst;
    void *arg;
    for (uint64 i = 0; i < ex->size; i++) {
        arg = ((instruction *) ex->get_ele(ex, i))->arg;
        if (arg != NULL)
            free(arg);
    }
    free(ex->start);
}